

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O1

char * mpp_get_vcodec_dev_name(MppCtxType type,MppCodingType coding)

{
  RockchipSocType RVar1;
  int iVar2;
  RK_U32 platform;
  char *pcVar3;
  char **ppcVar4;
  long lVar5;
  
  RVar1 = mpp_get_soc_type();
  switch(RVar1) {
  case ROCKCHIP_SOC_RK3036:
    if (type == MPP_CTX_ENC) {
      return (char *)0x0;
    }
    if (type == MPP_CTX_DEC && coding == MPP_VIDEO_CodingHEVC) {
      ppcVar4 = mpp_hevc_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_hevc_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x18) {
          return (char *)0x0;
        }
      }
    }
    else {
      ppcVar4 = mpp_vpu_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x18) {
          return (char *)0x0;
        }
      }
    }
    break;
  case ROCKCHIP_SOC_RK3066:
  case ROCKCHIP_SOC_RK3188:
    ppcVar4 = mpp_vpu_dev;
    lVar5 = 0;
    while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
      lVar5 = lVar5 + 8;
      if (lVar5 == 0x18) {
        return (char *)0x0;
      }
    }
    break;
  case ROCKCHIP_SOC_RK3288:
  case ROCKCHIP_SOC_RK312X:
  case ROCKCHIP_SOC_RK3368:
  case ROCKCHIP_SOC_RK3326:
  case ROCKCHIP_SOC_PX30:
    if (type == MPP_CTX_DEC && coding == MPP_VIDEO_CodingHEVC) {
      ppcVar4 = mpp_hevc_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_hevc_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x18) {
          return (char *)0x0;
        }
      }
    }
    else {
      ppcVar4 = mpp_vpu_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x18) {
          return (char *)0x0;
        }
      }
    }
    break;
  case ROCKCHIP_SOC_RK3399:
  case ROCKCHIP_SOC_RK3229:
    if ((type == MPP_CTX_DEC) &&
       (((coding == MPP_VIDEO_CodingAVC || (coding == MPP_VIDEO_CodingHEVC)) ||
        (coding == MPP_VIDEO_CodingVP9)))) {
      ppcVar4 = mpp_rkvdec_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_rkvdec_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x10) {
          return (char *)0x0;
        }
      }
    }
    else {
      ppcVar4 = mpp_vpu_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x18) {
          return (char *)0x0;
        }
      }
    }
    break;
  case ROCKCHIP_SOC_RK3228H:
    if (type == MPP_CTX_DEC) {
      if ((coding == MPP_VIDEO_CodingAVC) || (coding == MPP_VIDEO_CodingHEVC)) {
        ppcVar4 = mpp_rkvdec_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_rkvdec_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
      else if (coding == MPP_VIDEO_CodingAVS) {
        ppcVar4 = mpp_avsd_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_avsd_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
      else {
        ppcVar4 = mpp_vpu_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x18) {
            return (char *)0x0;
          }
        }
      }
    }
    else {
      if (type != MPP_CTX_ENC) {
        return (char *)0x0;
      }
      if (coding == MPP_VIDEO_CodingHEVC) {
        ppcVar4 = mpp_h265e_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_h265e_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
      else {
        ppcVar4 = mpp_vepu_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_vepu_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
    }
    break;
  case ROCKCHIP_SOC_RK3328:
    if (type == MPP_CTX_DEC) {
      if (((coding == MPP_VIDEO_CodingAVC) || (coding == MPP_VIDEO_CodingVP9)) ||
         (coding == MPP_VIDEO_CodingHEVC)) {
        ppcVar4 = mpp_rkvdec_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_rkvdec_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
      else {
        ppcVar4 = mpp_vpu_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x18) {
            return (char *)0x0;
          }
        }
      }
    }
    else {
      if (type != MPP_CTX_ENC) {
        return (char *)0x0;
      }
      if (coding == MPP_VIDEO_CodingHEVC) {
        ppcVar4 = mpp_h265e_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_h265e_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
      else {
        ppcVar4 = mpp_vepu_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_vepu_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
    }
    break;
  case ROCKCHIP_SOC_RK3228:
    if ((type == MPP_CTX_DEC) &&
       ((coding == MPP_VIDEO_CodingHEVC || (coding == MPP_VIDEO_CodingAVC)))) {
      ppcVar4 = mpp_rkvdec_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_rkvdec_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x10) {
          return (char *)0x0;
        }
      }
    }
    else {
      if (coding == MPP_VIDEO_CodingMJPEG && type == MPP_CTX_ENC) {
        return (char *)0x0;
      }
      ppcVar4 = mpp_vpu_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x18) {
          return (char *)0x0;
        }
      }
    }
    break;
  case ROCKCHIP_SOC_RV1108:
    if (coding == MPP_VIDEO_CodingAVC) {
      if (type == MPP_CTX_ENC) {
        ppcVar4 = mpp_rkvenc_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_rkvenc_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
      else {
        ppcVar4 = mpp_rkvdec_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_rkvdec_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
    }
    else {
      if (coding != MPP_VIDEO_CodingMJPEG) {
        return (char *)0x0;
      }
      ppcVar4 = mpp_vpu_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x18) {
          return (char *)0x0;
        }
      }
    }
    break;
  case ROCKCHIP_SOC_RV1109:
  case ROCKCHIP_SOC_RV1126:
    if ((coding == MPP_VIDEO_CodingAVC) || (coding == MPP_VIDEO_CodingHEVC)) {
      if (type == MPP_CTX_ENC) {
        ppcVar4 = mpp_rkvenc_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_rkvenc_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
      else {
        ppcVar4 = mpp_rkvdec_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_rkvdec_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
    }
    else {
      if (coding != MPP_VIDEO_CodingMJPEG) {
        return (char *)0x0;
      }
      ppcVar4 = mpp_vpu_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x18) {
          return (char *)0x0;
        }
      }
    }
    break;
  case ROCKCHIP_SOC_RK3128H:
    if ((type == MPP_CTX_DEC) &&
       ((coding == MPP_VIDEO_CodingHEVC || (coding == MPP_VIDEO_CodingAVC)))) {
      ppcVar4 = mpp_rkvdec_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_rkvdec_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x10) {
          return (char *)0x0;
        }
      }
    }
    else {
      if (coding == MPP_VIDEO_CodingMJPEG && type == MPP_CTX_ENC) {
        return (char *)0x0;
      }
      if (coding == MPP_VIDEO_CodingVP9 && type == MPP_CTX_DEC) {
        return (char *)0x0;
      }
      ppcVar4 = mpp_vpu_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x18) {
          return (char *)0x0;
        }
      }
    }
    break;
  default:
    platform = mpp_get_vcodec_type();
    pcVar3 = mpp_get_platform_dev_name(type,coding,platform);
    return pcVar3;
  case ROCKCHIP_SOC_RK3566:
  case ROCKCHIP_SOC_RK3567:
  case ROCKCHIP_SOC_RK3568:
    if (type == MPP_CTX_ENC) {
      if ((coding == MPP_VIDEO_CodingHEVC) || (coding == MPP_VIDEO_CodingAVC)) {
        ppcVar4 = mpp_rkvenc_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_rkvenc_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
      else {
        if ((coding & ~MPP_VIDEO_CodingAutoDetect) != MPP_VIDEO_CodingMJPEG) {
          return (char *)0x0;
        }
        ppcVar4 = mpp_vpu_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x18) {
            return (char *)0x0;
          }
        }
      }
      break;
    }
    if (type != MPP_CTX_DEC) {
      return (char *)0x0;
    }
    if ((int)coding < 10) {
      if (coding == MPP_VIDEO_CodingAVC) {
LAB_00122478:
        ppcVar4 = mpp_rkvdec_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_rkvdec_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
        break;
      }
      if (coding == MPP_VIDEO_CodingMJPEG) goto LAB_00122449;
    }
    else if ((coding == MPP_VIDEO_CodingVP9) || (coding == MPP_VIDEO_CodingHEVC)) goto LAB_00122478;
    ppcVar4 = mpp_vpu_dev;
    lVar5 = 0;
    while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
      lVar5 = lVar5 + 8;
      if (lVar5 == 0x18) {
        return (char *)0x0;
      }
    }
    break;
  case ROCKCHIP_SOC_RK3588:
    if (type == MPP_CTX_ENC) {
      if ((coding == MPP_VIDEO_CodingHEVC) || (coding == MPP_VIDEO_CodingAVC)) {
        ppcVar4 = mpp_rkvenc_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_rkvenc_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x10) {
            return (char *)0x0;
          }
        }
      }
      else {
        if ((coding & ~MPP_VIDEO_CodingAutoDetect) != MPP_VIDEO_CodingMJPEG) {
          return (char *)0x0;
        }
        ppcVar4 = mpp_vpu_dev;
        lVar5 = 0;
        while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
          lVar5 = lVar5 + 8;
          if (lVar5 == 0x18) {
            return (char *)0x0;
          }
        }
      }
      break;
    }
    if (type != MPP_CTX_DEC) {
      return (char *)0x0;
    }
    if ((int)coding < 10) {
      if (coding == MPP_VIDEO_CodingAVC) goto LAB_0012280f;
      if (coding == MPP_VIDEO_CodingMJPEG) goto LAB_00122449;
    }
    else if (((coding == MPP_VIDEO_CodingVP9) || (coding == MPP_VIDEO_CodingHEVC)) ||
            (coding == MPP_VIDEO_CodingAVS2)) {
LAB_0012280f:
      ppcVar4 = mpp_rkvdec_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_rkvdec_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x10) {
          return (char *)0x0;
        }
      }
      break;
    }
    ppcVar4 = mpp_vpu_dev;
    lVar5 = 0;
    while (iVar2 = access(*(char **)((long)mpp_vpu_dev + lVar5),0), iVar2 != 0) {
      lVar5 = lVar5 + 8;
      if (lVar5 == 0x18) {
        return (char *)0x0;
      }
    }
    break;
  case ROCKCHIP_SOC_RK3576:
  case ROCKCHIP_SOC_RV1126B:
    if (type == MPP_CTX_ENC) {
      if (coding == MPP_VIDEO_CodingMJPEG) goto LAB_00122449;
      ppcVar4 = mpp_rkvenc_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_rkvenc_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x10) {
          return (char *)0x0;
        }
      }
    }
    else {
      if (type != MPP_CTX_DEC) {
        return (char *)0x0;
      }
      if (coding == MPP_VIDEO_CodingMJPEG) {
LAB_00122449:
        iVar2 = access("/dev/mpp_service",0);
        if (iVar2 == 0) {
          return "/dev/mpp_service";
        }
        return (char *)0x0;
      }
      ppcVar4 = mpp_rkvdec_dev;
      lVar5 = 0;
      while (iVar2 = access(*(char **)((long)mpp_rkvdec_dev + lVar5),0), iVar2 != 0) {
        lVar5 = lVar5 + 8;
        if (lVar5 == 0x10) {
          return (char *)0x0;
        }
      }
    }
  }
  return *(char **)(lVar5 + (long)ppcVar4);
}

Assistant:

const char *mpp_get_vcodec_dev_name(MppCtxType type, MppCodingType coding)
{
    const char *dev = NULL;
    RockchipSocType soc_type = mpp_get_soc_type();

    switch (soc_type) {
    case ROCKCHIP_SOC_RK3036 : {
        /* rk3036 do NOT have encoder */
        if (type == MPP_CTX_ENC)
            dev = NULL;
        else if (coding == MPP_VIDEO_CodingHEVC && type == MPP_CTX_DEC)
            dev = mpp_find_device(mpp_hevc_dev);
        else
            dev = mpp_find_device(mpp_vpu_dev);
    } break;
    case ROCKCHIP_SOC_RK3066 :
    case ROCKCHIP_SOC_RK3188 : {
        /* rk3066/rk3188 have vpu1 only */
        dev = mpp_find_device(mpp_vpu_dev);
    } break;
    case ROCKCHIP_SOC_RK3288 :
    case ROCKCHIP_SOC_RK312X :
    case ROCKCHIP_SOC_RK3368 :
    case ROCKCHIP_SOC_RK3326 :
    case ROCKCHIP_SOC_PX30 : {
        /*
         * rk3288/rk312x/rk3368 have codec:
         * 1 - vpu1
         * 2 - RK hevc decoder
         */
        if (coding == MPP_VIDEO_CodingHEVC && type == MPP_CTX_DEC)
            dev = mpp_find_device(mpp_hevc_dev);
        else
            dev = mpp_find_device(mpp_vpu_dev);
    } break;
    case ROCKCHIP_SOC_RK3128H : {
        /*
         * rk3128H have codec:
         * 1 - vpu2
         * 2 - RK H.264/H.265 1080p@60fps decoder
         * NOTE: rk3128H do NOT have jpeg encoder
         */
        if (type == MPP_CTX_DEC &&
            (coding == MPP_VIDEO_CodingAVC ||
             coding == MPP_VIDEO_CodingHEVC))
            dev = mpp_find_device(mpp_rkvdec_dev);
        else if (type == MPP_CTX_ENC && coding == MPP_VIDEO_CodingMJPEG)
            dev = NULL;
        else if (type == MPP_CTX_DEC && coding == MPP_VIDEO_CodingVP9)
            dev = NULL;
        else
            dev = mpp_find_device(mpp_vpu_dev);
    } break;
    case ROCKCHIP_SOC_RK3399 :
    case ROCKCHIP_SOC_RK3229 : {
        /*
         * rk3399/rk3229 have codec:
         * 1 - vpu2
         * 2 - RK H.264/H.265/VP9 4K decoder
         */
        if (type == MPP_CTX_DEC &&
            (coding == MPP_VIDEO_CodingAVC ||
             coding == MPP_VIDEO_CodingHEVC ||
             coding == MPP_VIDEO_CodingVP9))
            dev = mpp_find_device(mpp_rkvdec_dev);
        else
            dev = mpp_find_device(mpp_vpu_dev);
    } break;
    case ROCKCHIP_SOC_RK3228 : {
        /*
         * rk3228 have codec:
         * 1 - vpu2
         * 2 - RK H.264/H.265 4K decoder
         * NOTE: rk3228 do NOT have jpeg encoder
         */
        if (type == MPP_CTX_DEC &&
            (coding == MPP_VIDEO_CodingAVC ||
             coding == MPP_VIDEO_CodingHEVC))
            dev = mpp_find_device(mpp_rkvdec_dev);
        else if (type == MPP_CTX_ENC && coding == MPP_VIDEO_CodingMJPEG)
            dev = NULL;
        else
            dev = mpp_find_device(mpp_vpu_dev);
    } break;
    case ROCKCHIP_SOC_RK3228H : {
        /*
         * rk3228h has codec:
         * 1 - vpu2
         * 2 - RK H.264/H.265 4K decoder
         * 3 - avs+ decoder
         * 4 - H.265 encoder
         */
        if (type == MPP_CTX_ENC) {
            if (coding == MPP_VIDEO_CodingHEVC)
                dev = mpp_find_device(mpp_h265e_dev);
            else
                dev = mpp_find_device(mpp_vepu_dev);
        } else if (type == MPP_CTX_DEC) {
            if (coding == MPP_VIDEO_CodingAVS)
                dev = mpp_find_device(mpp_avsd_dev);
            else if (coding == MPP_VIDEO_CodingAVC ||
                     coding == MPP_VIDEO_CodingHEVC)
                dev = mpp_find_device(mpp_rkvdec_dev);
            else
                dev = mpp_find_device(mpp_vpu_dev);
        }
    } break;
    case ROCKCHIP_SOC_RK3328 : {
        /*
         * rk3228 has codec:
         * 1 - vpu2
         * 2 - RK H.264/H.265/VP9 4K decoder
         * 4 - H.265 encoder
         */
        if (type == MPP_CTX_ENC) {
            if (coding == MPP_VIDEO_CodingHEVC)
                dev = mpp_find_device(mpp_h265e_dev);
            else
                dev = mpp_find_device(mpp_vepu_dev);
        } else if (type == MPP_CTX_DEC) {
            if (coding == MPP_VIDEO_CodingAVC ||
                coding == MPP_VIDEO_CodingHEVC ||
                coding == MPP_VIDEO_CodingVP9) {
                dev = mpp_find_device(mpp_rkvdec_dev);
            } else
                dev = mpp_find_device(mpp_vpu_dev);
        }
    } break;
    case ROCKCHIP_SOC_RV1108 : {
        /*
         * rv1108 has codec:
         * 1 - vpu2
         * 2 - RK H.264 4K decoder
         * 3 - RK H.264 4K encoder
         */
        if (coding == MPP_VIDEO_CodingAVC) {
            if (type == MPP_CTX_ENC)
                dev = mpp_find_device(mpp_rkvenc_dev);
            else
                dev = mpp_find_device(mpp_rkvdec_dev);
        } else if (coding == MPP_VIDEO_CodingMJPEG)
            dev = mpp_find_device(mpp_vpu_dev);
    } break;
    case ROCKCHIP_SOC_RV1109 :
    case ROCKCHIP_SOC_RV1126 : {
        /*
         * rv1108 has codec:
         * 1 - vpu2 for jpeg encoder and decoder
         * 2 - RK H.264/H.265 4K decoder
         * 3 - RK H.264/H.265 4K encoder
         */
        if (coding == MPP_VIDEO_CodingAVC || coding == MPP_VIDEO_CodingHEVC) {
            if (type == MPP_CTX_ENC)
                dev = mpp_find_device(mpp_rkvenc_dev);
            else
                dev = mpp_find_device(mpp_rkvdec_dev);
        } else if (coding == MPP_VIDEO_CodingMJPEG)
            dev = mpp_find_device(mpp_vpu_dev);
    } break;
    case ROCKCHIP_SOC_RK3566 :
    case ROCKCHIP_SOC_RK3567 :
    case ROCKCHIP_SOC_RK3568 : {
        /*
         * rk3566/rk3568 has codec:
         * 1 - vpu2 for jpeg/vp8 encoder and decoder
         * 2 - RK H.264/H.265/VP9 4K decoder
         * 3 - RK H.264/H.265 4K encoder
         * 3 - RK jpeg decoder
         */
        if (type == MPP_CTX_DEC) {
            if (coding == MPP_VIDEO_CodingAVC ||
                coding == MPP_VIDEO_CodingHEVC ||
                coding == MPP_VIDEO_CodingVP9)
                dev = mpp_find_device(mpp_rkvdec_dev);
            else if (coding == MPP_VIDEO_CodingMJPEG)
                dev = mpp_find_device(mpp_jpegd_dev);
            else
                dev = mpp_find_device(mpp_vpu_dev);
        } else if (type == MPP_CTX_ENC) {
            if (coding == MPP_VIDEO_CodingAVC ||
                coding == MPP_VIDEO_CodingHEVC)
                dev = mpp_find_device(mpp_rkvenc_dev);
            else if (coding == MPP_VIDEO_CodingMJPEG ||
                     coding == MPP_VIDEO_CodingVP8)
                dev = mpp_find_device(mpp_vpu_dev);
            else
                dev = NULL;
        }
    } break;
    case ROCKCHIP_SOC_RK3588 : {
        /*
         * rk3588 has codec:
         * 1 - RK H.264/H.265/VP9/AVS2 8K decoder
         * 2 - RK H.264/H.265 8K encoder
         * 3 - vpu2 for jpeg/vp8 encoder and decoder
         * 4 - RK jpeg decoder
         */
        if (type == MPP_CTX_DEC) {
            if (coding == MPP_VIDEO_CodingAVC ||
                coding == MPP_VIDEO_CodingHEVC ||
                coding == MPP_VIDEO_CodingAVS2 ||
                coding == MPP_VIDEO_CodingVP9)
                dev = mpp_find_device(mpp_rkvdec_dev);
            else if (coding == MPP_VIDEO_CodingMJPEG)
                dev = mpp_find_device(mpp_jpegd_dev);
            else
                dev = mpp_find_device(mpp_vpu_dev);
        } else if (type == MPP_CTX_ENC) {
            if (coding == MPP_VIDEO_CodingAVC ||
                coding == MPP_VIDEO_CodingHEVC)
                dev = mpp_find_device(mpp_rkvenc_dev);
            else if (coding == MPP_VIDEO_CodingMJPEG ||
                     coding == MPP_VIDEO_CodingVP8)
                dev = mpp_find_device(mpp_vpu_dev);
            else
                dev = NULL;
        }
    } break;
    case ROCKCHIP_SOC_RK3576 :
    case ROCKCHIP_SOC_RV1126B : {
        if (type == MPP_CTX_DEC) {
            if (coding == MPP_VIDEO_CodingMJPEG)
                dev = mpp_find_device(mpp_jpegd_dev);
            else
                dev = mpp_find_device(mpp_rkvdec_dev);
        } else if (type == MPP_CTX_ENC) {
            if (coding == MPP_VIDEO_CodingMJPEG)
                dev = mpp_find_device(mpp_jpege_dev);
            else
                dev = mpp_find_device(mpp_rkvenc_dev);
        }
    } break;
    default : {
        /* default case for unknown compatible  */
        RK_U32 vcodec_type = mpp_get_vcodec_type();

        dev = mpp_get_platform_dev_name(type, coding, vcodec_type);
    } break;
    }

    return dev;
}